

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

Json __thiscall JFSON::anon_unknown_22::JsonParser::parse_json(JsonParser *this,int depth)

{
  size_t sVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var5;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var7;
  byte bVar8;
  char cVar9;
  int iVar10;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *peVar11;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  mapped_type *pmVar13;
  size_t sVar14;
  long *plVar15;
  undefined8 *puVar16;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *extraout_RAX_06;
  size_t sVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char c;
  int in_EDX;
  char *pcVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  undefined **ppuVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  size_t sVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_16;
  undefined4 in_register_00000034;
  JsonParser *this_01;
  char *pcVar23;
  undefined1 auVar24 [8];
  size_t sVar25;
  bool c_00;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var26;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var27;
  __shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var28;
  Json JVar29;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
  data_1;
  vector<JFSON::Json,_std::allocator<JFSON::Json>_> data;
  size_type __dnew;
  char buf [12];
  undefined1 local_108 [8];
  undefined1 local_100 [24];
  _Base_ptr local_e8;
  size_t local_e0;
  undefined1 local_d8 [32];
  string local_b8;
  string local_98;
  _func_int **local_78;
  Json local_70;
  Json local_60;
  char local_4c [12];
  Json local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  
  this_01 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  if (in_EDX < 0xc9) {
    bVar8 = get_next_token(this_01);
    if (this_01->failed == true) {
      Json::Json((Json *)this);
      JVar29.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX_00._M_pi;
      JVar29.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           extraout_RAX_00;
      return (Json)JVar29.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    c_00 = 9 < (byte)(bVar8 - 0x30);
    if (bVar8 == 0x2d || !c_00) {
      sVar1 = this_01->i;
      sVar22 = sVar1 - 1;
      this_01->i = sVar22;
      pcVar2 = (this_01->str->_M_dataplus)._M_p;
      cVar9 = pcVar2[sVar1 - 1];
      sVar25 = sVar22;
      if (cVar9 == '-') {
        this_01->i = sVar1;
        cVar9 = pcVar2[sVar1];
        sVar25 = sVar1;
      }
      if (cVar9 == '0') {
        sVar17 = sVar25 + 1;
        this_01->i = sVar17;
        bVar8 = pcVar2[sVar25 + 1];
        if (9 < (byte)(bVar8 - 0x30)) {
LAB_001053bd:
          if (bVar8 == 0x2e) {
            this_01->i = sVar17 + 1;
            if (9 < (byte)(pcVar2[sVar17 + 1] - 0x30U)) {
              pcVar23 = "at least one digit required in fractional part";
              pcVar19 = "";
              goto LAB_001051ed;
            }
            sVar22 = sVar17 + 2;
            do {
              sVar17 = sVar22;
              this_01->i = sVar17;
              bVar8 = pcVar2[sVar17];
              sVar22 = sVar17 + 1;
            } while ((byte)(bVar8 - 0x30) < 10);
          }
          else if (((bVar8 != 0x45) && (bVar8 != 0x65)) && (sVar17 - sVar22 < 10)) {
            iVar10 = atoi(pcVar2 + (sVar1 - 1));
            peVar11 = (element_type *)operator_new(0x20);
            peVar11[1]._vptr_JsonValue = (_func_int **)0x100000001;
            peVar11->_vptr_JsonValue = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010daa0;
            *(int *)&peVar11[3]._vptr_JsonValue = iVar10;
            ppuVar20 = &PTR_type_0010daf0;
            goto LAB_00105974;
          }
          if ((bVar8 | 0x20) == 0x65) {
            sVar22 = sVar17 + 1;
            this_01->i = sVar22;
            cVar9 = pcVar2[sVar17 + 1];
            if ((cVar9 == '-') || (cVar9 == '+')) {
              sVar22 = sVar17 + 2;
              this_01->i = sVar22;
              cVar9 = pcVar2[sVar17 + 2];
            }
            if (9 < (byte)(cVar9 - 0x30U)) {
              pcVar23 = "at least one digit required in exponent";
              pcVar19 = "";
              goto LAB_001051ed;
            }
            do {
              sVar22 = sVar22 + 1;
              this_01->i = sVar22;
            } while ((byte)(pcVar2[sVar22] - 0x30U) < 10);
          }
          local_78 = (_func_int **)strtod(pcVar2 + (sVar1 - 1),(char **)0x0);
          peVar11 = (element_type *)operator_new(0x20);
          peVar11[1]._vptr_JsonValue = (_func_int **)0x100000001;
          peVar11->_vptr_JsonValue = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010d9a0;
          peVar11[3]._vptr_JsonValue = local_78;
          ppuVar20 = &PTR_type_0010d9f0;
LAB_00105974:
          _Var4._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar20;
          _Var4._M_ptr = peVar11;
          peVar11[2]._vptr_JsonValue = (_func_int **)ppuVar20;
          this->str = (string *)(peVar11 + 2);
          this->i = (size_t)peVar11;
          return (Json)_Var4;
        }
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_100 + 8);
        local_b8._M_dataplus._M_p = (pointer)0x23;
        local_108 = (undefined1  [8])paVar12;
        local_108 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_108,(ulong)&local_b8);
        local_100._8_8_ = local_b8._M_dataplus._M_p;
        *(undefined8 *)local_108 = 0x20676e696461656c;
        ((element_type *)((long)local_108 + 8))->_vptr_JsonValue = (_func_int **)0x7020746f6e207330;
        ((element_type *)((long)local_108 + 0x10))->_vptr_JsonValue =
             (_func_int **)0x64657474696d7265;
        ((element_type *)((long)local_108 + 0x18))->_vptr_JsonValue =
             (_func_int **)0x626d756e206e6920;
        builtin_strncpy((char *)((long)&((element_type *)((long)local_108 + 0x18))->_vptr_JsonValue
                                + 7),"bers",4);
        local_100._0_8_ = local_b8._M_dataplus._M_p;
        local_b8._M_dataplus._M_p[(long)local_108] = '\0';
        _Var27 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                 fail(this,(string *)this_01);
        auVar24 = local_108;
      }
      else {
        if ((byte)(cVar9 - 0x31U) < 9) {
          do {
            sVar17 = sVar25 + 1;
            this_01->i = sVar17;
            bVar8 = pcVar2[sVar25 + 1];
            sVar25 = sVar17;
          } while ((byte)(bVar8 - 0x30) < 10);
          goto LAB_001053bd;
        }
        if (cVar9 < ' ') {
          snprintf((char *)&local_98,0xc,"(%d)",(ulong)(uint)(int)cVar9);
        }
        else {
          snprintf((char *)&local_98,0xc,"\'%c\' (%d)",cVar9,cVar9);
        }
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d8 + 0x10);
        local_d8._0_8_ = paVar12;
        sVar14 = strlen((char *)&local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,&local_98,(long)&local_98._M_dataplus._M_p + sVar14);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x109445);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar18) {
          local_b8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_b8.field_2._8_8_ = plVar15[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_b8._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_b8._M_string_length = plVar15[1];
        *plVar15 = (long)paVar18;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar18) {
          local_100._8_8_ = paVar18->_M_allocated_capacity;
          local_100._16_8_ = puVar16[3];
          local_108 = (undefined1  [8])(local_100 + 8);
        }
        else {
          local_100._8_8_ = paVar18->_M_allocated_capacity;
          local_108 = (undefined1  [8])*puVar16;
        }
        local_100._0_8_ = puVar16[1];
        *puVar16 = paVar18;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        _Var27 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                 fail(this,(string *)this_01);
        if (local_108 != (undefined1  [8])(local_100 + 8)) {
          operator_delete((void *)local_108);
          _Var27._M_refcount._M_pi = extraout_RDX_13._M_pi;
          _Var27._M_ptr = extraout_RAX_03;
        }
        auVar24 = (undefined1  [8])local_d8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
          _Var27._M_refcount._M_pi = extraout_RDX_14._M_pi;
          _Var27._M_ptr = extraout_RAX_04;
          auVar24 = (undefined1  [8])local_d8._0_8_;
        }
      }
      if (auVar24 == (undefined1  [8])paVar12) {
        return (Json)_Var27;
      }
      goto LAB_0010520e;
    }
    if (bVar8 < 0x6e) {
      if (bVar8 == 0x22) {
        (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_((string *)local_108,this_01);
        Json::Json((Json *)this,(string *)local_108);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_100 + 8);
        _Var21._M_pi = extraout_RDX_02;
      }
      else {
        if (bVar8 == 0x5b) {
          local_d8._0_8_ = (string *)0x0;
          local_d8._8_8_ = (pointer)0x0;
          local_d8._16_8_ = (string *)0x0;
          cVar9 = get_next_token(this_01);
          if (cVar9 != ']') {
            while( true ) {
              this_01->i = this_01->i - 1;
              parse_json((JsonParser *)local_108,depth);
              std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::emplace_back<JFSON::Json>
                        ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)local_d8,
                         (Json *)local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_);
              }
              if (this_01->failed == true) {
                Json::Json((Json *)this);
                goto LAB_00105bf7;
              }
              cVar9 = get_next_token(this_01);
              if (cVar9 != ',') break;
              get_next_token(this_01);
            }
            if (cVar9 != ']') {
              esc_abi_cxx11_(&local_b8,(JFSON *)(ulong)(uint)(int)cVar9,c);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,"expected \',\' in list, got ",&local_b8);
              fail(this,(string *)this_01);
              if (local_108 != (undefined1  [8])(local_100 + 8)) {
                operator_delete((void *)local_108);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              goto LAB_00105bf7;
            }
          }
          Json::Json((Json *)this,(array *)local_d8);
LAB_00105bf7:
          std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::~vector
                    ((vector<JFSON::Json,_std::allocator<JFSON::Json>_> *)local_d8);
          _Var6._M_refcount._M_pi = extraout_RDX_16._M_pi;
          _Var6._M_ptr = extraout_RAX_06;
          return (Json)_Var6;
        }
        if (bVar8 == 0x66) {
          local_108 = (undefined1  [8])(local_100 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"false","");
          Json::Json(&local_70,false);
          _Var28 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                   expect(this,(string *)this_01,(Json *)local_108);
          goto LAB_0010549b;
        }
LAB_00105562:
        esc_abi_cxx11_(&local_b8,(JFSON *)(ulong)(uint)(int)(char)bVar8,c_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"expected value, got ",&local_b8);
        JVar29 = fail(this,(string *)this_01);
        _Var21._M_pi = JVar29.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        if (local_108 != (undefined1  [8])(local_100 + 8)) {
          operator_delete((void *)local_108);
          _Var21._M_pi = extraout_RDX_04;
        }
        paVar12 = &local_b8.field_2;
      }
      _Var5._M_refcount._M_pi = _Var21._M_pi;
      _Var5._M_ptr = (element_type *)paVar12;
      auVar24 = (undefined1  [8])
                ((element_type *)(&paVar12->_M_allocated_capacity + -2))->_vptr_JsonValue;
      if (auVar24 == (undefined1  [8])paVar12) {
        return (Json)_Var5;
      }
      goto LAB_0010520e;
    }
    if (bVar8 != 0x6e) {
      if (bVar8 == 0x7b) {
        local_100._16_8_ = local_100;
        local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
        local_100._8_8_ = 0;
        local_e0 = 0;
        local_e8 = (_Base_ptr)local_100._16_8_;
        bVar8 = get_next_token(this_01);
        _Var21._M_pi = extraout_RDX_05;
        if (bVar8 != 0x7d) {
          do {
            if (bVar8 != 0x22) {
              esc_abi_cxx11_((string *)local_d8,(JFSON *)(ulong)(uint)(int)(char)bVar8,
                             (char)_Var21._M_pi);
              std::operator+(&local_b8,"expected \'\"\' in object, got ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8);
              fail(this,(string *)this_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_d8 + 0x10)) {
                operator_delete((void *)local_d8._0_8_);
              }
              goto LAB_00105b0d;
            }
            (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_(&local_b8,this_01);
            if (this_01->failed == true) {
              Json::Json((Json *)this);
              iVar10 = 1;
              bVar8 = 0x22;
              _Var21._M_pi = extraout_RDX_06;
            }
            else {
              bVar8 = get_next_token(this_01);
              if (bVar8 == 0x3a) {
                parse_json((JsonParser *)local_d8,depth);
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                                        *)local_108,&local_b8);
                this_00 = (pmVar13->m_ptr).
                          super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pmVar13->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)local_d8._0_8_;
                (pmVar13->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                if ((this_01->failed & 1U) == 0) {
                  bVar8 = get_next_token(this_01);
                  if (bVar8 == 0x2c) {
                    bVar8 = get_next_token(this_01);
                    iVar10 = 0;
                    _Var21._M_pi = extraout_RDX_12;
                  }
                  else {
                    iVar10 = 3;
                    _Var21._M_pi = extraout_RDX_08;
                    if (bVar8 != 0x7d) {
                      esc_abi_cxx11_(&local_98,(JFSON *)(ulong)(uint)(int)(char)bVar8,
                                     (char)extraout_RDX_08);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d8,"expected \',\' in object, got ",&local_98);
                      goto LAB_00105836;
                    }
                  }
                }
                else {
                  Json::Json((Json *)this);
                  iVar10 = 1;
                  bVar8 = 0x3a;
                  _Var21._M_pi = extraout_RDX_07;
                }
              }
              else {
                if ((char)bVar8 < ' ') {
                  snprintf(local_4c,0xc,"(%d)",(ulong)(uint)(int)(char)bVar8);
                }
                else {
                  snprintf(local_4c,0xc,"\'%c\' (%d)",(ulong)bVar8,(ulong)bVar8);
                }
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                sVar14 = strlen(local_4c);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_98,local_4c,local_4c + sVar14);
                puVar16 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x10939f);
                local_d8._0_8_ = local_d8 + 0x10;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar16 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar16 == paVar12) {
                  local_d8._16_8_ = paVar12->_M_allocated_capacity;
                  local_d8._24_8_ = puVar16[3];
                }
                else {
                  local_d8._16_8_ = paVar12->_M_allocated_capacity;
                  local_d8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar16;
                }
                local_d8._8_8_ = puVar16[1];
                *puVar16 = paVar12;
                puVar16[1] = 0;
                *(undefined1 *)(puVar16 + 2) = 0;
LAB_00105836:
                JVar29 = fail(this,(string *)this_01);
                _Var21._M_pi = JVar29.m_ptr.
                               super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_);
                  _Var21._M_pi = extraout_RDX_09;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p);
                  _Var21._M_pi = extraout_RDX_10;
                }
                iVar10 = 1;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
              _Var21._M_pi = extraout_RDX_11;
            }
          } while (iVar10 == 0);
          if (iVar10 != 3) goto LAB_00105b0d;
        }
        Json::Json((Json *)this,(object *)local_108);
LAB_00105b0d:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
                     *)local_108);
        _Var7._M_refcount._M_pi = extraout_RDX_15._M_pi;
        _Var7._M_ptr = extraout_RAX_05;
        return (Json)_Var7;
      }
      if (bVar8 != 0x74) goto LAB_00105562;
      local_108 = (undefined1  [8])(local_100 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"true","");
      Json::Json(&local_60,true);
      _Var28 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
               expect(this,(string *)this_01,(Json *)local_108);
      local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_60.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
LAB_0010549b:
      if (local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var28._M_refcount._M_pi = extraout_RDX_01._M_pi;
        _Var28._M_ptr = extraout_RAX_01;
      }
      auVar24 = local_108;
      if (local_108 == (undefined1  [8])(local_100 + 8)) {
        return (Json)_Var28;
      }
      goto LAB_0010520e;
    }
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"null","");
    Json::Json(&local_40);
    _Var26 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
             expect(this,(string *)this_01,(Json *)local_108);
    if (local_40.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var26._M_refcount._M_pi = extraout_RDX_03._M_pi;
      _Var26._M_ptr = extraout_RAX_02;
    }
  }
  else {
    pcVar23 = "exceeded maximum nesting depth";
    pcVar19 = "";
LAB_001051ed:
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar23,pcVar19);
    _Var26 = (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
             fail(this,(string *)this_01);
  }
  auVar24 = local_108;
  if (local_108 == (undefined1  [8])(local_100 + 8)) {
    return (Json)_Var26;
  }
LAB_0010520e:
  operator_delete((void *)auVar24);
  _Var3._M_refcount._M_pi = extraout_RDX._M_pi;
  _Var3._M_ptr = extraout_RAX;
  return (shared_ptr<JFSON::JsonValue>)(shared_ptr<JFSON::JsonValue>)_Var3;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }